

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUtils.h
# Opt level: O2

void __thiscall
phaeton::TensorGraph<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>::plot
          (TensorGraph<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID> *this,
          ofstream *OS)

{
  _Base_ptr p_Var1;
  GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID> *pGVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID> *pGVar6;
  AddressID<phaeton::ExpressionNode> *Id;
  EdgeMap *__range2;
  string local_70;
  string local_50;
  
  poVar3 = std::operator<<((ostream *)OS,"digraph <");
  poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
  std::operator<<(poVar3,"> {\n");
  for (p_Var4 = (this->Nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->Nodes)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    poVar3 = std::operator<<((ostream *)OS,"\"");
    AddressID<phaeton::ExpressionNode>::str_abi_cxx11_
              (&local_70,(AddressID<phaeton::ExpressionNode> *)(p_Var4 + 1));
    poVar3 = std::operator<<(poVar3,(string *)&local_70);
    poVar3 = std::operator<<(poVar3,"\"");
    poVar3 = std::operator<<(poVar3," [label=\"");
    poVar3 = std::operator<<(poVar3,(string *)&p_Var4[1]._M_parent);
    std::operator<<(poVar3,"\"];\n");
    std::__cxx11::string::~string((string *)&local_70);
  }
  for (p_Var5 = (this->Edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(this->Edges)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    p_Var4 = (p_Var5[3]._M_left)->_M_parent;
    p_Var1 = (p_Var5[3]._M_left)->_M_right;
    poVar3 = std::operator<<((ostream *)OS,"\"");
    AddressID<phaeton::ExpressionNode>::str_abi_cxx11_
              (&local_70,(AddressID<phaeton::ExpressionNode> *)&p_Var4->_M_parent);
    poVar3 = std::operator<<(poVar3,(string *)&local_70);
    poVar3 = std::operator<<(poVar3,"\" -> \"");
    AddressID<phaeton::ExpressionNode>::str_abi_cxx11_
              (&local_50,(AddressID<phaeton::ExpressionNode> *)&p_Var1->_M_parent);
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    poVar3 = std::operator<<(poVar3,"\"");
    poVar3 = std::operator<<(poVar3," [label=\"");
    poVar3 = std::operator<<(poVar3,(string *)&p_Var5[1]._M_parent);
    std::operator<<(poVar3,"\"];\n");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  pGVar6 = getStartNode(this);
  while (pGVar2 = (pGVar6->Seq).Succ,
        pGVar2 != (GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID> *)0x0)
  {
    poVar3 = std::operator<<((ostream *)OS,"\"");
    AddressID<phaeton::ExpressionNode>::str_abi_cxx11_(&local_70,&pGVar6->ID);
    poVar3 = std::operator<<(poVar3,(string *)&local_70);
    poVar3 = std::operator<<(poVar3,"\" -> \"");
    AddressID<phaeton::ExpressionNode>::str_abi_cxx11_(&local_50,&pGVar2->ID);
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    poVar3 = std::operator<<(poVar3,"\"");
    std::operator<<(poVar3," [style=dashed];\n");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    pGVar6 = pGVar2;
  }
  std::operator<<((ostream *)OS,"}\n");
  return;
}

Assistant:

void TensorGraph<NodeID, EdgeID>::plot(std::ofstream &OS) const {
  OS << "digraph <" << this << "> {\n";

  for (const auto &N : Nodes) {
    const NodeID &Id = N.first;
    OS << "\"" << Id.str() << "\""
       << " [label=\"" << Id.getLabel() << "\"];\n";
  }

  for (const auto &E : Edges) {
    const EdgeID &Id = E.first;
    const NodeID &Src = E.second->getSrcNode()->getID();
    const NodeID &Target = E.second->getTargetNode()->getID();

    OS << "\"" << Src.str() << "\" -> \"" << Target.str() << "\""
       << " [label=\"" << Id.getLabel() << "\"];\n";
  }

  const GraphNode<NodeID, EdgeID> *N = getStartNode();
  while (N->hasSucc()) {
    const GraphNode<NodeID, EdgeID> *Succ = N->getSucc();
    const NodeID &NId = N->getID();
    const NodeID &SuccId = Succ->getID();

    OS << "\"" << NId.str() << "\" -> \"" << SuccId.str() << "\""
       << " [style=dashed];\n";

    N = Succ;
  }

  OS << "}\n";
}